

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LazyJSONString.cpp
# Opt level: O3

Var __thiscall Js::LazyJSONString::TryParse(LazyJSONString *this)

{
  JSONProperty *prop;
  ulong uVar1;
  Var pvVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  bool bVar6;
  
  prop = (this->jsonContent).ptr;
  if (prop == (JSONProperty *)0x0) {
    return (Var)0x0;
  }
  uVar1 = (ulong)*(uint *)&(this->super_JavascriptString).field_0x1c;
  if (uVar1 != 0) {
    bVar5 = true;
    uVar3 = 1;
    do {
      uVar4 = (ulong)(ushort)(this->gap).ptr[uVar3 - 1];
      if ((0x20 < uVar4) || ((0x100000600U >> (uVar4 & 0x3f) & 1) == 0)) break;
      bVar5 = uVar3 < uVar1;
      bVar6 = uVar3 != uVar1;
      uVar3 = uVar3 + 1;
    } while (bVar6);
    if (bVar5) {
      return (Var)0x0;
    }
  }
  pvVar2 = ReconstructVar(this,prop);
  return pvVar2;
}

Assistant:

Var
LazyJSONString::TryParse() const
{
    // If we have thrown away our metadata, we won't be able to Parse
    if (this->jsonContent == nullptr)
    {
        return nullptr;
    }

    // If the gap is complex, this means that parse will be a non-trivial transformation,
    // so fall back to the real parse
    if (this->HasComplexGap())
    {
        return nullptr;
    }

    Var result = ReconstructVar(this->jsonContent);

    return result;
}